

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorBuilder::IsInPackage
          (DescriptorBuilder *this,FileDescriptor *file,string *package_name)

{
  bool bVar1;
  string *psVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  undefined1 local_22;
  undefined1 local_21;
  string *package_name_local;
  FileDescriptor *file_local;
  DescriptorBuilder *this_local;
  
  psVar2 = FileDescriptor::package_abi_cxx11_(file);
  bVar1 = HasPrefixString(psVar2,package_name);
  local_21 = false;
  if (bVar1) {
    FileDescriptor::package_abi_cxx11_(file);
    lVar3 = std::__cxx11::string::size();
    lVar4 = std::__cxx11::string::size();
    local_22 = true;
    if (lVar3 != lVar4) {
      psVar2 = FileDescriptor::package_abi_cxx11_(file);
      std::__cxx11::string::size();
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)psVar2);
      local_22 = *pcVar5 == '.';
    }
    local_21 = local_22;
  }
  return local_21;
}

Assistant:

bool DescriptorBuilder::IsInPackage(const FileDescriptor* file,
                                    const string& package_name) {
  return HasPrefixString(file->package(), package_name) &&
           (file->package().size() == package_name.size() ||
            file->package()[package_name.size()] == '.');
}